

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

bool crunch::progress_callback_func(uint32 percentage_complete,void *pUser_data_ptr)

{
  undefined4 in_register_0000003c;
  console *this;
  uint local_30;
  uint local_2c;
  uint32 i_3;
  uint32 i_2;
  uint32 i_1;
  uint32 i;
  char buf [8];
  void *pUser_data_ptr_local;
  uint32 percentage_complete_local;
  
  buf = (char  [8])pUser_data_ptr;
  crnlib::console::disable_crlf((console *)CONCAT44(in_register_0000003c,percentage_complete));
  for (i_2 = 0; i_2 < 7; i_2 = i_2 + 1) {
    *(undefined1 *)((long)&i_1 + (ulong)i_2) = 8;
  }
  i._3_1_ = 0;
  for (i_3 = 0; i_3 < 0x10; i_3 = i_3 + 1) {
    crnlib::console::progress((char *)&i_1);
  }
  crnlib::console::progress("Processing: %u%%",(ulong)percentage_complete);
  for (local_2c = 0; local_2c < 7; local_2c = local_2c + 1) {
    *(undefined1 *)((long)&i_1 + (ulong)local_2c) = 0x20;
  }
  crnlib::console::progress((char *)&i_1);
  crnlib::console::progress((char *)&i_1);
  for (local_30 = 0; local_30 < 7; local_30 = local_30 + 1) {
    *(undefined1 *)((long)&i_1 + (ulong)local_30) = 8;
  }
  crnlib::console::progress((char *)&i_1);
  this = (console *)&i_1;
  crnlib::console::progress((char *)this);
  crnlib::console::enable_crlf(this);
  return true;
}

Assistant:

static bool progress_callback_func(uint32 percentage_complete, void* pUser_data_ptr)
    {
        pUser_data_ptr;

        console::disable_crlf();

        char buf[8];
        for (uint32 i = 0; i < 7; i++)
        {
            buf[i] = 8;
        }
        buf[7] = '\0';

        for (uint32 i = 0; i < 130 / 8; i++)
        {
            console::progress(buf);
        }

        console::progress("Processing: %u%%", percentage_complete);

        for (uint32 i = 0; i < 7; i++)
        {
            buf[i] = ' ';
        }
        console::progress(buf);
        console::progress(buf);

        for (uint32 i = 0; i < 7; i++)
        {
            buf[i] = 8;
        }
        console::progress(buf);
        console::progress(buf);

        console::enable_crlf();

        return true;
    }